

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_fixed_point.cpp
# Opt level: O0

void Disa::forward_sweep(Matrix_Sparse *a_matrix,Vector_Dense<double,_0UL> *x_vector,
                        Vector_Dense<double,_0UL> *x_update,Vector_Dense<double,_0UL> *b_vector,
                        Scalar omega)

{
  double dVar1;
  double dVar2;
  Scalar SVar3;
  size_t sVar4;
  Vector_Dense<double,_0UL> *this;
  bool bVar5;
  Scalar SVar6;
  size_t *psVar7;
  const_reference pvVar8;
  Scalar *pSVar9;
  reference pvVar10;
  double dVar11;
  double dVar12;
  Matrix_Sparse_Row<const_Disa::Matrix_Sparse> local_b0;
  Matrix_Sparse_Row<const_Disa::Matrix_Sparse> local_a0;
  const_iterator local_90;
  Matrix_Sparse_Row<const_Disa::Matrix_Sparse> local_70;
  undefined1 local_60 [8];
  const_iterator column_iter;
  Scalar offs_row_dot;
  size_t i_row;
  Scalar omega_local;
  Vector_Dense<double,_0UL> *b_vector_local;
  Vector_Dense<double,_0UL> *x_update_local;
  Vector_Dense<double,_0UL> *x_vector_local;
  Matrix_Sparse *a_matrix_local;
  
  offs_row_dot = 0.0;
  i_row = (size_t)omega;
  omega_local = (Scalar)b_vector;
  b_vector_local = x_update;
  x_update_local = x_vector;
  x_vector_local = (Vector_Dense<double,_0UL> *)a_matrix;
  while( true ) {
    SVar3 = offs_row_dot;
    SVar6 = (Scalar)Matrix_Sparse::size_row((Matrix_Sparse *)x_vector_local);
    if ((ulong)SVar6 <= (ulong)SVar3) break;
    column_iter.matrix = (matrix_type *)0x0;
    local_70 = Matrix_Sparse::operator[]((Matrix_Sparse *)x_vector_local,(size_t *)&offs_row_dot);
    Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::cbegin((const_iterator *)local_60,&local_70);
    while( true ) {
      local_a0 = Matrix_Sparse::operator[]((Matrix_Sparse *)x_vector_local,(size_t *)&offs_row_dot);
      Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::cend(&local_90,&local_a0);
      bVar5 = Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::operator!=
                        ((Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)local_60,
                         &local_90);
      sVar4 = i_row;
      if (!bVar5) break;
      pSVar9 = (Scalar *)
               Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::i_column
                         ((Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)local_60);
      if (*pSVar9 != offs_row_dot) {
        pSVar9 = Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::operator*
                           ((Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)local_60);
        this = x_update_local;
        dVar1 = *pSVar9;
        psVar7 = Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::i_column
                           ((Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)local_60);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&this->super_vector<double,_std::allocator<double>_>,*psVar7);
        column_iter.matrix = (matrix_type *)(dVar1 * *pvVar8 + (double)column_iter.matrix);
      }
      Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::operator++
                ((Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)local_60);
    }
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)omega_local,
                        (size_type)offs_row_dot);
    dVar12 = *pvVar8 - (double)column_iter.matrix;
    local_b0 = Matrix_Sparse::operator[]((Matrix_Sparse *)x_vector_local,(size_t *)&offs_row_dot);
    pSVar9 = Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::operator[]
                       (&local_b0,(size_t *)&offs_row_dot);
    dVar1 = *pSVar9;
    dVar11 = 1.0 - (double)i_row;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&x_update_local->super_vector<double,_std::allocator<double>_>,
                        (size_type)offs_row_dot);
    dVar2 = *pvVar8;
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                        (&b_vector_local->super_vector<double,_std::allocator<double>_>,
                         (size_type)offs_row_dot);
    *pvVar10 = dVar11 * dVar2 + ((double)sVar4 * dVar12) / dVar1;
    offs_row_dot = (Scalar)((long)offs_row_dot + 1);
  }
  return;
}

Assistant:

inline void forward_sweep(const Matrix_Sparse& a_matrix, const Vector_Dense<Scalar, 0>& x_vector,
                          Vector_Dense<Scalar, 0>& x_update, const Vector_Dense<Scalar, 0>& b_vector,
                          const Scalar omega = 1) {
  // forward sweep
  FOR(i_row, a_matrix.size_row()) {
    Scalar offs_row_dot = 0;
    FOR_ITER(column_iter, a_matrix[i_row])
    if(column_iter.i_column() != i_row) offs_row_dot += *column_iter * x_vector[column_iter.i_column()];
    x_update[i_row] =
    omega * (b_vector[i_row] - offs_row_dot) / a_matrix[i_row][i_row] + (1.0 - omega) * x_vector[i_row];
  }
}